

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O3

parser_error parse_curse_name(parser *p)

{
  undefined1 auVar1 [16];
  char *pcVar2;
  void *pvVar3;
  undefined8 *v;
  void *pvVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar7;
  
  pcVar2 = parser_getstr(p,"name");
  pvVar3 = parser_priv(p);
  v = (undefined8 *)mem_zalloc(0x38);
  pvVar4 = mem_zalloc(0x148);
  v[3] = pvVar4;
  auVar1 = _DAT_00224950;
  lVar5 = 0;
  auVar6 = _DAT_002256f0;
  auVar8 = _DAT_00224940;
  do {
    auVar9 = auVar8 ^ auVar1;
    if (auVar9._4_4_ == -0x80000000 && auVar9._0_4_ < -0x7fffffe4) {
      *(undefined2 *)((long)pvVar4 + lVar5 * 4 + 0x74) = 100;
      *(undefined2 *)((long)pvVar4 + lVar5 * 4 + 0x78) = 100;
    }
    auVar9 = auVar6 ^ auVar1;
    if (auVar9._4_4_ == -0x80000000 && auVar9._0_4_ < -0x7fffffe4) {
      *(undefined2 *)((long)pvVar4 + lVar5 * 4 + 0x7c) = 100;
      *(undefined2 *)((long)pvVar4 + lVar5 * 4 + 0x80) = 100;
    }
    lVar5 = lVar5 + 4;
    lVar7 = auVar8._8_8_;
    auVar8._0_8_ = auVar8._0_8_ + 4;
    auVar8._8_8_ = lVar7 + 4;
    lVar7 = auVar6._8_8_;
    auVar6._0_8_ = auVar6._0_8_ + 4;
    auVar6._8_8_ = lVar7 + 4;
  } while (lVar5 != 0x1c);
  *v = pvVar3;
  parser_setpriv(p,v);
  pcVar2 = string_make(pcVar2);
  v[1] = pcVar2;
  pvVar3 = mem_zalloc(0x24);
  v[2] = pvVar3;
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_curse_name(struct parser *p) {
	const char *name = parser_getstr(p, "name");
	struct curse *h = parser_priv(p);
	int i;

	struct curse *curse = mem_zalloc(sizeof *curse);
	curse->obj = mem_zalloc(sizeof(struct object));
	for (i = 0; i < ELEM_MAX; i++) {
		curse->obj->el_info[i].res_level = RES_LEVEL_BASE;
	}
	curse->next = h;
	parser_setpriv(p, curse);
	curse->name = string_make(name);
	curse->poss = mem_zalloc(TV_MAX * sizeof(bool));

	return PARSE_ERROR_NONE;
}